

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_Error FT_Stream_EnterFrame(FT_Stream stream,FT_ULong count)

{
  FT_Memory memory_00;
  FT_Pointer pvVar1;
  ulong uVar2;
  long local_38;
  FT_Memory memory;
  FT_ULong read_bytes;
  FT_ULong FStack_18;
  FT_Error error;
  FT_ULong count_local;
  FT_Stream stream_local;
  
  read_bytes._4_4_ = 0;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if ((stream->pos < stream->size) && (count <= stream->size - stream->pos)) {
      stream->cursor = stream->base + stream->pos;
      stream->limit = stream->cursor + count;
      stream->pos = count + stream->pos;
    }
    else {
      read_bytes._4_4_ = 0x55;
    }
  }
  else {
    memory_00 = stream->memory;
    if (stream->size < count) {
      read_bytes._4_4_ = 0x55;
    }
    else {
      FStack_18 = count;
      count_local = (FT_ULong)stream;
      pvVar1 = ft_mem_qalloc(memory_00,count,(FT_Error *)((long)&read_bytes + 4));
      *(FT_Pointer *)count_local = pvVar1;
      if (read_bytes._4_4_ == 0) {
        uVar2 = (**(code **)(count_local + 0x28))
                          (count_local,*(undefined8 *)(count_local + 0x10),
                           *(undefined8 *)count_local,FStack_18);
        if (uVar2 < FStack_18) {
          ft_mem_free(memory_00,*(void **)count_local);
          *(undefined8 *)count_local = 0;
          read_bytes._4_4_ = 0x55;
        }
        *(undefined8 *)(count_local + 0x40) = *(undefined8 *)count_local;
        if (*(long *)(count_local + 0x40) == 0) {
          local_38 = 0;
        }
        else {
          local_38 = *(long *)(count_local + 0x40) + FStack_18;
        }
        *(long *)(count_local + 0x48) = local_38;
        *(ulong *)(count_local + 0x10) = uVar2 + *(long *)(count_local + 0x10);
      }
    }
  }
  return read_bytes._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Stream_EnterFrame( FT_Stream  stream,
                        FT_ULong   count )
  {
    FT_Error  error = FT_Err_Ok;
    FT_ULong  read_bytes;


    FT_TRACE7(( "FT_Stream_EnterFrame: %ld bytes\n", count ));

    /* check for nested frame access */
    FT_ASSERT( stream && stream->cursor == 0 );

    if ( stream->read )
    {
      /* allocate the frame in memory */
      FT_Memory  memory = stream->memory;


      /* simple sanity check */
      if ( count > stream->size )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " frame size (%lu) larger than stream size (%lu)\n",
                   count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

#ifdef FT_DEBUG_MEMORY
      /* assume `ft_debug_file_` and `ft_debug_lineno_` are already set */
      stream->base = (unsigned char*)ft_mem_qalloc( memory,
                                                    (FT_Long)count,
                                                    &error );
      if ( error )
        goto Exit;
#else
      if ( FT_QALLOC( stream->base, count ) )
        goto Exit;
#endif
      /* read it */
      read_bytes = stream->read( stream, stream->pos,
                                 stream->base, count );
      if ( read_bytes < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid read; expected %lu bytes, got %lu\n",
                   count, read_bytes ));

        FT_FREE( stream->base );
        error = FT_THROW( Invalid_Stream_Operation );
      }

      stream->cursor = stream->base;
      stream->limit  = FT_OFFSET( stream->cursor, count );
      stream->pos   += read_bytes;
    }
    else
    {
      /* check current and new position */
      if ( stream->pos >= stream->size        ||
           stream->size - stream->pos < count )
      {
        FT_ERROR(( "FT_Stream_EnterFrame:"
                   " invalid i/o; pos = 0x%lx, count = %lu, size = 0x%lx\n",
                   stream->pos, count, stream->size ));

        error = FT_THROW( Invalid_Stream_Operation );
        goto Exit;
      }

      /* set cursor */
      stream->cursor = stream->base + stream->pos;
      stream->limit  = stream->cursor + count;
      stream->pos   += count;
    }

  Exit:
    return error;
  }